

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int libssh2_session_method_pref(LIBSSH2_SESSION *session,int method_type,char *prefs)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  LIBSSH2_COMMON_METHOD *pLVar3;
  bool bVar4;
  char *local_90;
  int local_78;
  int method_len;
  char *p;
  LIBSSH2_COMMON_METHOD **mlist;
  int prefs_len;
  char *newprefs;
  char *s;
  char **prefvar;
  char *prefs_local;
  int method_type_local;
  LIBSSH2_SESSION *session_local;
  
  sVar2 = strlen(prefs);
  switch(method_type) {
  case 0:
    s = (char *)&session->kex_prefs;
    p = (char *)libssh2_kex_methods;
    break;
  case 1:
    s = (char *)&session->hostkey_prefs;
    p = (char *)libssh2_hostkey_methods();
    break;
  case 2:
    s = (char *)&(session->local).crypt_prefs;
    p = (char *)libssh2_crypt_methods();
    break;
  case 3:
    s = (char *)&(session->remote).crypt_prefs;
    p = (char *)libssh2_crypt_methods();
    break;
  case 4:
    s = (char *)&(session->local).mac_prefs;
    p = (char *)_libssh2_mac_methods();
    break;
  case 5:
    s = (char *)&(session->remote).mac_prefs;
    p = (char *)_libssh2_mac_methods();
    break;
  case 6:
    s = (char *)&(session->local).comp_prefs;
    p = (char *)_libssh2_comp_methods(session);
    break;
  case 7:
    s = (char *)&(session->remote).comp_prefs;
    p = (char *)_libssh2_comp_methods(session);
    break;
  case 8:
    s = (char *)&(session->local).lang_prefs;
    p = (char *)0x0;
    break;
  case 9:
    s = (char *)&(session->remote).lang_prefs;
    p = (char *)0x0;
    break;
  default:
    iVar1 = _libssh2_error(session,-0x22,"Invalid parameter specified for method_type");
    return iVar1;
  }
  __s = (char *)(*session->alloc)((long)((int)sVar2 + 1),&session->abstract);
  if (__s == (char *)0x0) {
    session_local._4_4_ = _libssh2_error(session,-6,"Error allocated space for method preferences");
  }
  else {
    memcpy(__s,prefs,(long)((int)sVar2 + 1));
    newprefs = __s;
    while( true ) {
      bVar4 = false;
      if ((newprefs != (char *)0x0) && (bVar4 = false, *newprefs != '\0')) {
        bVar4 = p != (char *)0x0;
      }
      if (!bVar4) break;
      local_90 = strchr(newprefs,0x2c);
      if (local_90 == (char *)0x0) {
        sVar2 = strlen(newprefs);
        local_78 = (int)sVar2;
      }
      else {
        local_78 = (int)local_90 - (int)newprefs;
      }
      pLVar3 = kex_get_method_by_name(newprefs,(long)local_78,(LIBSSH2_COMMON_METHOD **)p);
      if (pLVar3 == (LIBSSH2_COMMON_METHOD *)0x0) {
        if (local_90 == (char *)0x0) {
          if (__s < newprefs) {
            newprefs[-1] = '\0';
          }
          else {
            *newprefs = '\0';
          }
        }
        else {
          sVar2 = strlen(newprefs);
          memcpy(newprefs,local_90 + 1,sVar2 - (long)local_78);
        }
      }
      if (local_90 == (char *)0x0) {
        local_90 = (char *)0x0;
      }
      else {
        local_90 = local_90 + 1;
      }
      newprefs = local_90;
    }
    sVar2 = strlen(__s);
    if (sVar2 == 0) {
      (*session->free)(__s,&session->abstract);
      session_local._4_4_ =
           _libssh2_error(session,-0x21,"The requested method(s) are not currently supported");
    }
    else {
      if (*(long *)s != 0) {
        (*session->free)(*(void **)s,&session->abstract);
      }
      *(char **)s = __s;
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_session_method_pref(LIBSSH2_SESSION * session, int method_type,
                            const char *prefs)
{
    char **prefvar, *s, *newprefs;
    int prefs_len = strlen(prefs);
    const LIBSSH2_COMMON_METHOD **mlist;

    switch (method_type) {
    case LIBSSH2_METHOD_KEX:
        prefvar = &session->kex_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_kex_methods;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        prefvar = &session->hostkey_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_hostkey_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        prefvar = &session->local.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        prefvar = &session->remote.crypt_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) libssh2_crypt_methods();
        break;

    case LIBSSH2_METHOD_MAC_CS:
        prefvar = &session->local.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_MAC_SC:
        prefvar = &session->remote.mac_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **) _libssh2_mac_methods();
        break;

    case LIBSSH2_METHOD_COMP_CS:
        prefvar = &session->local.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)
            _libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_COMP_SC:
        prefvar = &session->remote.comp_prefs;
        mlist = (const LIBSSH2_COMMON_METHOD **)
            _libssh2_comp_methods(session);
        break;

    case LIBSSH2_METHOD_LANG_CS:
        prefvar = &session->local.lang_prefs;
        mlist = NULL;
        break;

    case LIBSSH2_METHOD_LANG_SC:
        prefvar = &session->remote.lang_prefs;
        mlist = NULL;
        break;

    default:
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "Invalid parameter specified for method_type");
    }

    s = newprefs = LIBSSH2_ALLOC(session, prefs_len + 1);
    if (!newprefs) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Error allocated space for method preferences");
    }
    memcpy(s, prefs, prefs_len + 1);

    while (s && *s && mlist) {
        char *p = strchr(s, ',');
        int method_len = p ? (p - s) : (int) strlen(s);

        if (!kex_get_method_by_name(s, method_len, mlist)) {
            /* Strip out unsupported method */
            if (p) {
                memcpy(s, p + 1, strlen(s) - method_len);
            } else {
                if (s > newprefs) {
                    *(--s) = '\0';
                } else {
                    *s = '\0';
                }
            }
        }

        s = p ? (p + 1) : NULL;
    }

    if (strlen(newprefs) == 0) {
        LIBSSH2_FREE(session, newprefs);
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "The requested method(s) are not currently "
                              "supported");
    }

    if (*prefvar) {
        LIBSSH2_FREE(session, *prefvar);
    }
    *prefvar = newprefs;

    return 0;
}